

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

EmptyMemberSymbol *
slang::ast::EmptyMemberSymbol::fromSyntax
          (Compilation *compilation,Scope *scope,EmptyMemberSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Symbol *this;
  long lVar1;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar2;
  SourceRange sourceRange;
  Token local_28;
  
  local_28.info = (Info *)local_28._0_8_;
  local_28._0_8_ = parsing::Token::location(&syntax->semi);
  this = &BumpAllocator::emplace<slang::ast::EmptyMemberSymbol,slang::SourceLocation>
                    (&compilation->super_BumpAllocator,(SourceLocation *)&local_28)->super_Symbol;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(this,scope,syntax_00);
  if (((syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value == 0) && (((syntax->semi).field_0x2 & 1) == 0)) {
    local_28 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
    sVar2 = parsing::Token::trivia(&local_28);
    if (sVar2._M_extent._M_extent_value._M_extent_value != 0) {
      lVar1 = 0;
      do {
        if ((&(sVar2._M_ptr)->kind)[lVar1] == SkippedTokens) {
          return (EmptyMemberSymbol *)this;
        }
        lVar1 = lVar1 + 0x10;
      } while (sVar2._M_extent._M_extent_value._M_extent_value * 0x10 != lVar1);
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    Scope::addDiag(scope,(DiagCode)0xee0006,sourceRange);
  }
  return (EmptyMemberSymbol *)this;
}

Assistant:

EmptyMemberSymbol& EmptyMemberSymbol::fromSyntax(Compilation& compilation, const Scope& scope,
                                                 const EmptyMemberSyntax& syntax) {
    auto result = compilation.emplace<EmptyMemberSymbol>(syntax.semi.location());
    result->setAttributes(scope, syntax.attributes);

    // Report a warning if this is just an empty semicolon hanging out for no reason,
    // but don't report if this was inserted due to an error elsewhere.
    if (syntax.attributes.empty() && !syntax.semi.isMissing()) {
        // If there are skipped nodes behind this semicolon don't report the warning,
        // as it's likely it's due to the error itself.
        bool anySkipped = false;
        for (auto trivia : syntax.getFirstToken().trivia()) {
            if (trivia.kind == TriviaKind::SkippedTokens) {
                anySkipped = true;
                break;
            }
        }

        if (!anySkipped)
            scope.addDiag(diag::EmptyMember, syntax.sourceRange());
    }

    return *result;
}